

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O2

void Commands::ReloadConfig
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *arguments,Command_Source *from)

{
  int iVar1;
  undefined4 extraout_var;
  undefined8 local_30 [4];
  
  (*from->_vptr_Command_Source[2])(local_30);
  Console::Out("Config reloaded by %s",local_30[0]);
  std::__cxx11::string::~string((string *)local_30);
  iVar1 = (*from->_vptr_Command_Source[4])(from);
  World::Rehash((World *)CONCAT44(extraout_var,iVar1));
  return;
}

Assistant:

void ReloadConfig(const std::vector<std::string>& arguments, Command_Source* from)
{
	(void)arguments;

	Console::Out("Config reloaded by %s", from->SourceName().c_str());
	from->SourceWorld()->Rehash();
}